

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_PLTE(ucvector *out,LodePNGColorMode *info)

{
  uchar **in_RSI;
  uchar *puVar1;
  uint error;
  size_t j;
  size_t i;
  uchar *chunk;
  uchar *chunk_00;
  undefined8 in_stack_ffffffffffffffd8;
  uchar *puVar2;
  ucvector *in_stack_ffffffffffffffe0;
  uint local_4;
  
  chunk_00 = (uchar *)0x8;
  local_4 = lodepng_chunk_init(in_RSI,in_stack_ffffffffffffffe0,
                               (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(char *)0x8);
  if (local_4 == 0) {
    for (puVar2 = (uchar *)0x0; puVar2 != in_RSI[2]; puVar2 = puVar2 + 1) {
      chunk_00[(long)&in_stack_ffffffffffffffe0->data] = in_RSI[1][(long)puVar2 * 4];
      puVar1 = chunk_00 + 2;
      (chunk_00 + 1)[(long)&in_stack_ffffffffffffffe0->data] = in_RSI[1][(long)puVar2 * 4 + 1];
      chunk_00 = chunk_00 + 3;
      puVar1[(long)&in_stack_ffffffffffffffe0->data] = in_RSI[1][(long)puVar2 * 4 + 2];
    }
    lodepng_chunk_generate_crc(chunk_00);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static unsigned addChunk_PLTE(ucvector* out, const LodePNGColorMode* info) {
  unsigned char* chunk;
  size_t i, j = 8;

  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, info->palettesize * 3, "PLTE"));

  for(i = 0; i != info->palettesize; ++i) {
    /*add all channels except alpha channel*/
    chunk[j++] = info->palette[i * 4 + 0];
    chunk[j++] = info->palette[i * 4 + 1];
    chunk[j++] = info->palette[i * 4 + 2];
  }

  lodepng_chunk_generate_crc(chunk);
  return 0;
}